

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLineCam::ChLineCam(ChLineCam *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChFunction *__tmp;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> _Var4;
  
  _Var4 = (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLineCam_00b3e208;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> = _Var4;
  (this->center).m_data[0] = (double)_Var4._M_ptr;
  (this->center).m_data[1] = (double)_Var4._M_refcount._M_pi;
  (this->center).m_data[2] = 0.0;
  *(undefined8 *)&(this->super_ChLine).complexityU = 10;
  (this->super_ChLine).closed = true;
  this->Rb = 1.0;
  this->Rr = 0.0;
  this->p = 1.8;
  this->d = 2.0;
  this->b0 = 0.5235987755982988;
  dVar2 = DAT_00b689a0;
  if (this != (ChLineCam *)(Q_ROTATE_Z_TO_X + 0x18)) {
    (this->center).m_data[0] = VNULL;
    (this->center).m_data[1] = dVar2;
    (this->center).m_data[2] = DAT_00b689a8;
  }
  auVar1 = vmovhps_avx((undefined1  [16])_Var4,0x3ff0000000000000);
  this->e = (double)auVar1._0_8_;
  this->s = (double)auVar1._8_8_;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b03ad8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b443a0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  this_00 = (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->negative = false;
  this->internal = false;
  return;
}

Assistant:

ChLineCam::ChLineCam() {
    Set_complexity(10);
    this->closed = true;
    type = CAM_TYPE_SLIDEFOLLOWER;
    Rb = 1.0;
    Rr = 0.0;
    p = 1.8;
    d = 2;
    b0 = CH_C_PI / 6.0;
    center = VNULL;
    e = 0;
    s = Rb;
    law = chrono_types::make_shared<ChFunction_Const>(0);  // default law = no follower motion
    negative = false;
    internal = false;
}